

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::NavigationBar::showScreen(NavigationBar *this,QWidget *s)

{
  QStack<int> *this_00;
  Type *text;
  Data *dd;
  QStackedWidget *pQVar1;
  Data *dd_00;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar7;
  pointer piVar8;
  NavigationBarPrivate *pNVar9;
  QWidget *local_40;
  QWidget *local_38;
  
  local_38 = s;
  bVar3 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&local_38);
  if (!bVar3) {
    return;
  }
  iVar4 = QStackedWidget::currentIndex();
  if (iVar4 == -1) {
    return;
  }
  pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&((this->d).d)->itemsMap,&local_38);
  text = pQVar7->value;
  dd = pQVar7->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar9 = (this->d).d;
  pQVar1 = pNVar9->stack;
  QStackedWidget::currentIndex();
  local_40 = (QWidget *)QStackedWidget::widget((int)pQVar1);
  pQVar7 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar9->itemsMap,&local_40);
  dd_00 = pQVar7->d;
  if (dd_00 != (Data *)0x0) {
    LOCK();
    (dd_00->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd_00->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar9 = (this->d).d;
  if ((pNVar9->backStack).super_QList<int>.d.size != 0) {
    this_00 = &pNVar9->backStack;
    pDVar2 = (this_00->super_QList<int>).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
      QArrayDataPointer<int>::reallocateAndGrow
                ((QArrayDataPointer<int> *)this_00,GrowsAtEnd,0,(QArrayDataPointer<int> *)0x0);
    }
    piVar8 = QList<int>::data(&this_00->super_QList<int>);
    iVar4 = piVar8[(pNVar9->backStack).super_QList<int>.d.size + -1];
    iVar5 = QStackedWidget::currentIndex();
    if (iVar4 == iVar5) goto LAB_00164f55;
    pNVar9 = (this->d).d;
  }
  uVar6 = QStackedWidget::currentIndex();
  local_40 = (QWidget *)CONCAT44(local_40._4_4_,uVar6);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&pNVar9->backStack,(pNVar9->backStack).super_QList<int>.d.size,
             (int *)&local_40);
  QAbstractButton::setText((QString *)((this->d).d)->left);
  QWidget::show();
LAB_00164f55:
  QList<int>::clear(&(((this->d).d)->forwardStack).super_QList<int>);
  QWidget::hide();
  TextLabel::setText(((this->d).d)->title,&text->title);
  QStackedWidget::setCurrentWidget((QWidget *)((this->d).d)->stack);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBar::showScreen( QWidget * s )
{
	if( d->itemsMap.contains( s ) && currentIndex() != -1 )
	{
		QSharedPointer< NavigationItem > nextItem = d->itemsMap[ s ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->backStack.isEmpty() || d->backStack.top() != currentIndex() )
		{
			d->backStack.push( currentIndex() );

			d->left->setText( currentItem->title );
			d->left->show();
		}

		d->forwardStack.clear();
		d->right->hide();

		d->title->setText( nextItem->title );

		d->stack->setCurrentWidget( nextItem->self );
	}
}